

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void outchar_noxlat_stream(out_stream_info *stream,char c)

{
  ushort *puVar1;
  byte bVar2;
  ushort uVar3;
  mcmcxdef *cctx;
  char cVar4;
  uchar uVar5;
  uint uVar6;
  int iVar7;
  ushort **ppuVar8;
  __int32_t **pp_Var9;
  uchar *puVar10;
  size_t sVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  byte bVar19;
  long lVar20;
  char *pcVar21;
  byte bVar22;
  int iVar23;
  char *__s;
  bool bVar24;
  char tmpbuf [2048];
  int tmpattr [2048];
  undefined1 local_2838 [2048];
  undefined1 local_2038 [8200];
  
  uVar14 = 0x20;
  if (((c != '\x1a') && (uVar14 = 9, c != '\x19')) && (uVar14 = (ulong)(byte)c, -1 < c)) {
    ppuVar8 = __ctype_b_loc();
    uVar14 = 0x20;
    if ((*(byte *)((long)*ppuVar8 + (ulong)(byte)c * 2 + 1) & 0x20) == 0) {
      uVar14 = (ulong)(byte)c;
    }
  }
  bVar19 = (byte)uVar14;
  if (stream->capsflag == '\0') {
    if ((stream->allcapsflag != '\0') && (-1 < (char)bVar19)) goto LAB_00130cb0;
LAB_00130cc7:
    if ((stream->nocapsflag != '\0') && (-1 < (char)bVar19)) {
      ppuVar8 = __ctype_b_loc();
      if (((*ppuVar8)[uVar14] >> 10 & 1) != 0) {
        if (((*ppuVar8)[uVar14] >> 8 & 1) != 0) {
          pp_Var9 = __ctype_tolower_loc();
          bVar19 = *(byte *)(*pp_Var9 + uVar14);
        }
        stream->nocapsflag = '\0';
      }
    }
  }
  else if (-1 < (char)bVar19) {
LAB_00130cb0:
    ppuVar8 = __ctype_b_loc();
    if (((*ppuVar8)[uVar14] >> 10 & 1) == 0) goto LAB_00130cc7;
    if (((*ppuVar8)[uVar14] >> 9 & 1) != 0) {
      pp_Var9 = __ctype_toupper_loc();
      bVar19 = *(byte *)(*pp_Var9 + uVar14);
    }
    stream->capsflag = '\0';
  }
  if (stream->capturing != 0) {
    if (stream->capture_obj == 0xffff) {
      return;
    }
    puVar10 = mcmlck(stream->capture_ctx,stream->capture_obj);
    cctx = stream->capture_ctx;
    uVar3 = stream->capture_obj;
    uVar6 = stream->capture_ofs;
    if (*(ushort *)
         ((long)&cctx->mcmcxgl->mcmcxtab[cctx->mcmcxmtb[uVar3 >> 8][uVar3 & 0xff] >> 8]->mcmosiz +
         (ulong)((cctx->mcmcxmtb[uVar3 >> 8][uVar3 & 0xff] & 0xff) << 5)) <= uVar6) {
      puVar10 = mcmrealo(cctx,uVar3,(short)uVar6 + 0x100);
      uVar6 = stream->capture_ofs;
    }
    stream->capture_ofs = uVar6 + 1;
    puVar10[uVar6] = bVar19;
    uVar3 = stream->capture_ctx->mcmcxmtb[stream->capture_obj >> 8][stream->capture_obj & 0xff];
    puVar1 = (ushort *)
             ((long)&stream->capture_ctx->mcmcxgl->mcmcxtab[uVar3 >> 8]->mcmoflg +
             (ulong)((uVar3 & 0xff) << 5));
    *puVar1 = *puVar1 | 1;
    mcmunlck(stream->capture_ctx,stream->capture_obj);
    return;
  }
  bVar22 = stream->linecol;
  if ((int)(bVar22 + 1) < G_os_linewidth) {
    if (-1 < (char)bVar19) {
      ppuVar8 = __ctype_b_loc();
      bVar24 = (*(byte *)((long)*ppuVar8 + (ulong)bVar19 * 2 + 1) & 0x20) == 0;
      if (((c == '\x1a') || (bVar22 != 0)) || (bVar19 == 9 || bVar24)) {
        if (((bVar22 != 0 && c != '\x1a') && (bVar19 != 9 && !bVar24)) &&
           (stream->html_pre_level == 0)) {
          bVar2 = stream->linepos;
          uVar14 = (ulong)bVar2;
          bVar12 = stream->linebuf[uVar14 - 1];
          uVar15 = (ulong)(char)bVar12;
          if ((-1 < (long)uVar15) && ((*(byte *)((long)*ppuVar8 + uVar15 * 2 + 1) & 0x20) != 0)) {
            return;
          }
          if (doublespace != 0) {
            uVar18 = uVar14;
            if (bVar2 != 1) {
              do {
                uVar6 = (uint)uVar15 & 0xff;
                if (uVar6 < 0x3f) {
                  switch(uVar6) {
                  case 0x21:
                    goto switchD_00131192_caseD_21;
                  case 0x22:
                  case 0x27:
                  case 0x29:
                    goto switchD_00131192_caseD_22;
                  case 0x23:
                  case 0x24:
                  case 0x25:
                  case 0x26:
                  case 0x28:
                    goto switchD_00131192_caseD_23;
                  default:
                    if ((uVar6 == 0x2e) || (uVar6 == 0x3a)) goto switchD_00131192_caseD_21;
                    goto switchD_00131192_caseD_23;
                  }
                }
                if ((uVar6 != 0x5d) && (uVar6 != 0x7d)) {
                  if (uVar6 == 0x3f) goto switchD_00131192_caseD_21;
                  goto switchD_00131192_caseD_23;
                }
switchD_00131192_caseD_22:
                bVar12 = stream->linebuf[uVar18 - 2];
                uVar15 = (ulong)bVar12;
                uVar18 = uVar18 - 1;
              } while (uVar18 != 1);
            }
            if ((bVar12 < 0x40) && ((0x8400400200000000U >> ((ulong)bVar12 & 0x3f) & 1) != 0)) {
switchD_00131192_caseD_21:
              stream->attrbuf[uVar14] = stream->cur_attr;
              stream->linepos = bVar2 + 1;
              stream->linebuf[uVar14] = bVar19;
              bVar22 = bVar22 + 1;
            }
          }
        }
      }
      else {
        if (stream->html_pre_level == 0) {
          return;
        }
        bVar22 = 0;
      }
    }
switchD_00131192_caseD_23:
    bVar2 = stream->linepos;
    stream->attrbuf[bVar2] = stream->cur_attr;
    stream->linepos = bVar2 + 1;
    stream->linebuf[bVar2] = bVar19;
    stream->linecol = bVar22 + 1;
    return;
  }
  if ((char)bVar19 < '\0') {
    uVar17 = (uint)stream->linepos;
    uVar6 = stream->linepos - 1;
LAB_00130f68:
    if (-1 < (int)uVar6) {
LAB_00130f70:
      uVar14 = (ulong)(uVar6 + 1);
      lVar16 = uVar14 + 0x204;
      lVar20 = (ulong)uVar6 + 0x10;
      do {
        bVar22 = stream->linebuf[lVar20 + -0x10];
        if ((long)(char)bVar22 < 0) {
          iVar7 = stream->os_line_wrap;
        }
        else {
          ppuVar8 = __ctype_b_loc();
          if (((*(byte *)((long)*ppuVar8 + (long)(char)bVar22 * 2 + 1) & 0x20) != 0) ||
             (iVar7 = stream->os_line_wrap, bVar22 == 0x2d && iVar7 == 0)) {
            stream->linebuf[uVar17] = '\0';
            __s = (char *)((long)stream + lVar16 + -500);
            sVar11 = strlen(__s);
            memcpy(local_2838,__s,sVar11 + 1);
            memcpy(local_2038,stream->linebuf + lVar16 * 4 + -0x10,sVar11 * 4);
            ppuVar8 = __ctype_b_loc();
            pcVar21 = stream->linebuf + lVar20 + -0x10;
            if (((*ppuVar8)[bVar22] >> 0xd & 1) == 0) {
              pcVar21 = __s;
            }
            *pcVar21 = '\0';
            outflushn_stream(stream,2 - (uint)(stream->os_line_wrap == 0));
            memcpy(stream->linebuf,local_2838,sVar11 + 1);
            memcpy(stream->attrbuf,local_2038,sVar11 * 4);
            stream->linepos = (uchar)sVar11;
            if ((uchar)sVar11 != '\0') {
              cVar4 = '\0';
              uVar14 = 0;
              do {
                cVar4 = (cVar4 + '\x01') - ((byte)stream->linebuf[uVar14] < 0x1a);
                uVar14 = uVar14 + 1;
              } while ((sVar11 & 0xff) != uVar14);
              uVar5 = cVar4 + '\x01';
              goto LAB_00131114;
            }
            goto LAB_00131112;
          }
        }
        lVar16 = lVar16 + -1;
        lVar20 = lVar20 + -1;
        iVar23 = (int)uVar14;
        uVar6 = iVar23 - 1;
        uVar14 = (ulong)uVar6;
      } while (uVar6 != 0 && 0 < iVar23);
      goto LAB_001310f4;
    }
  }
  else {
    ppuVar8 = __ctype_b_loc();
    if (((c != '\x1a') && (((*ppuVar8)[bVar19] & 0x2000) != 0)) && (bVar19 != 9)) {
      bVar19 = stream->linepos;
      if (stream->linebuf[(ulong)bVar19 - 1] == ' ') {
        return;
      }
      stream->attrbuf[bVar19] = stream->cur_attr;
      stream->linepos = bVar19 + 1;
      stream->linebuf[bVar19] = ' ';
      return;
    }
    bVar22 = stream->linepos;
    uVar17 = (uint)bVar22;
    uVar6 = bVar22 - 1;
    uVar14 = (ulong)uVar6;
    if (bVar19 != 0x2d) goto LAB_00130f68;
    uVar6 = (uint)bVar22;
    if (bVar22 == 0) {
LAB_001310c5:
      if (-1 < (int)uVar14) {
        do {
          uVar6 = (uint)uVar14;
          if (((long)stream->linebuf[uVar14] < 0) ||
             ((*(byte *)((long)*ppuVar8 + (long)stream->linebuf[uVar14] * 2 + 1) & 0x20) == 0))
          goto LAB_00130f70;
          uVar14 = (ulong)(uVar6 - 1);
        } while (0 < (int)uVar6);
      }
    }
    else {
      do {
        uVar14 = (ulong)(uVar6 - 1);
        if (stream->linebuf[uVar14] != '-') goto LAB_001310c5;
        uVar13 = uVar6 - 1;
        bVar24 = 0 < (int)uVar6;
        uVar6 = uVar13;
      } while (uVar13 != 0 && bVar24);
    }
  }
  iVar7 = stream->os_line_wrap;
LAB_001310f4:
  outflushn_stream(stream,(uint)(iVar7 != 0) * 3 + 1);
  sVar11 = 0;
  stream->linepos = '\0';
  stream->linebuf[0] = '\0';
LAB_00131112:
  uVar5 = '\x01';
LAB_00131114:
  stream->attrbuf[sVar11 & 0xff] = stream->cur_attr;
  stream->linepos = (char)sVar11 + '\x01';
  stream->linebuf[sVar11 & 0xff] = bVar19;
  stream->linecol = uVar5;
  return;
}

Assistant:

static void outchar_noxlat_stream(out_stream_info *stream, char c)
{
    int  i;
    int  qspace;
    
    /* check for the special quoted space character */
    if (c == QSPACE)
    {
        /* it's a quoted space - note it and convert it to a regular space */
        qspace = 1;
        c = ' ';
    }
    else if (c == QTAB)
    {
        /* it's a hard tab - convert it to an ordinary tab */
        c = '\t';
        qspace = 0;
    }
    else
    {
        /* translate any whitespace character to a regular space character */
        if (outissp(c))
            c = ' ';
        
        /* it's not a quoted space */
        qspace = 0;
    }

    /* check for the caps/nocaps flags */
    if ((stream->capsflag || stream->allcapsflag) && outisal(c))
    {
        /* capsflag is set, so capitalize this character */
        if (outislo(c))
            c = toupper(c);

        /* okay, we've capitalized something; clear flag */
        stream->capsflag = 0;
    }
    else if (stream->nocapsflag && outisal(c))
    {
        /* nocapsflag is set, so minisculize this character */
        if (outisup(c))
            c = tolower(c);

        /* clear the flag now that we've done the job */
        stream->nocapsflag = 0;
    }

    /* if in capture mode, simply capture the character */
    if (stream->capturing)
    {
        uchar *p;

        /* if we have a valid capture object, copy to it */
        if (stream->capture_obj != MCMONINV)
        {
            /* lock the object holding the captured text */
            p = mcmlck(stream->capture_ctx, stream->capture_obj);
            
            /* make sure the capture object is big enough */
            if (mcmobjsiz(stream->capture_ctx, stream->capture_obj)
                <= stream->capture_ofs)
            {
                /* expand the object by another 256 bytes */
                p = mcmrealo(stream->capture_ctx, stream->capture_obj,
                             (ushort)(stream->capture_ofs + 256));
            }
            
            /* add this character */
            *(p + stream->capture_ofs++) = c;
            
            /* unlock the capture object */
            mcmtch(stream->capture_ctx, stream->capture_obj);
            mcmunlck(stream->capture_ctx, stream->capture_obj);
        }

        /*
         *   we're done - we don't want to actually display the character
         *   while capturing 
         */
        return;
    }

    /* add the character to out output buffer, flushing as needed */
    if (stream->linecol + 1 < G_os_linewidth)
    {
        /* 
         *   there's room for this character, so add it to the buffer 
         */
        
        /* ignore non-quoted space at start of line outside of PRE */
        if (outissp(c) && c != '\t' && stream->linecol == 0 && !qspace
            && stream->html_pre_level == 0)
            return;

        /* is this a non-quoted space not at the start of the line? */
        if (outissp(c) && c != '\t' && stream->linecol != 0 && !qspace
            && stream->html_pre_level == 0)
        {
            int  pos1 = stream->linepos - 1;
            char p = stream->linebuf[pos1];     /* check previous character */

            /* ignore repeated spaces - collapse into a single space */
            if (outissp(p))
                return;

            /*
             *   Certain punctuation requires a double space: a period, a
             *   question mark, an exclamation mark, or a colon; or any of
             *   these characters followed by any number of single and/or
             *   double quotes.  First, scan back to before any quotes, if
             *   are on one now, then check the preceding character; if
             *   it's one of the punctuation marks requiring a double
             *   space, add this space a second time.  (In addition to
             *   scanning back past quotes, scan past parentheses,
             *   brackets, and braces.)  Don't double the spacing if we're
             *   not in the normal doublespace mode; some people may
             *   prefer single spacing after punctuation, so we make this
             *   a run-time option.  
             */
            if (doublespace)
            {
                /* find the previous relevant punctuation character */
                while (pos1 &&
                       (p == '"' || p == '\'' || p == ')' || p == ']'
                        || p == '}'))
                {
                    p = stream->linebuf[--pos1];
                }
                if ( p == '.' || p == '?' || p == '!' || p == ':' )
                {
                    /* a double-space is required after this character */
                    stream->attrbuf[stream->linepos] = stream->cur_attr;
                    stream->linebuf[stream->linepos++] = c;
                    ++(stream->linecol);
                }
            }
        }

        /* add this character to the buffer */
        stream->attrbuf[stream->linepos] = stream->cur_attr;
        stream->linebuf[stream->linepos++] = c;

        /* advance the output column position */
        ++(stream->linecol);
        return;
    }

    /*
     *   The line would overflow if this character were added.  Find the
     *   most recent word break, and output the line up to the previous
     *   word.  Note that if we're trying to output a space, we'll just
     *   add it to the line buffer.  If the last character of the line
     *   buffer is already a space, we won't do anything right now.  
     */
    if (outissp(c) && c != '\t' && !qspace)
    {
        /* this is a space, so we're at a word break */
        if (stream->linebuf[stream->linepos - 1] != ' ')
        {
            stream->attrbuf[stream->linepos] = stream->cur_attr;
            stream->linebuf[stream->linepos++] = ' ';
        }
        return;
    }
    
    /*
     *   Find the most recent word break: look for a space or dash, starting
     *   at the end of the line.  
     *   
     *   If we're about to write a hyphen, we want to skip all contiguous
     *   hyphens, because we want to keep them together as a single
     *   punctuation mark; then keep going in the normal manner, which will
     *   keep the hyphens plus the word they're attached to together as a
     *   single unit.  If spaces precede the sequence of hyphens, include
     *   the prior word as well.  
     */
    i = stream->linepos - 1;
    if (c == '-')
    {
        /* skip any contiguous hyphens at the end of the line */
        for ( ; i >= 0 && stream->linebuf[i] == '-' ; --i) ;
        
        /* skip any spaces preceding the sequence of hyphens */
        for ( ; i >= 0 && outissp(stream->linebuf[i]) ; --i) ;
    }

    /* 
     *   Now find the preceding space.  If we're doing our own wrapping
     *   (i.e., we're not using OS line wrapping), then look for the
     *   nearest hyphen as well. 
     */
    for ( ; i >= 0 && !outissp(stream->linebuf[i])
          && !(!stream->os_line_wrap && stream->linebuf[i] == '-') ; --i) ;

    /* check to see if we found a good place to break */
    if (i < 0)
    {
        /* 
         *   we didn't find any good place to break - flush the entire
         *   line as-is, breaking arbitrarily in the middle of a word 
         */
        out_flushline(stream, FALSE);

        /* 
         *   we've completely cleared out the line buffer, so reset all of
         *   the line buffer counters 
         */
        stream->linepos = 0;
        stream->linecol = 0;
        stream->linebuf[0] = '\0';
    }
    else
    {
        char brkchar;
        char tmpbuf[MAXWIDTH];
        int tmpattr[MAXWIDTH];
        size_t tmpcnt;

        /* remember the word-break character */        
        brkchar = stream->linebuf[i];

        /* null-terminate the line buffer */        
        stream->linebuf[stream->linepos] = '\0';

        /* the next line starts after the break - save a copy */
        tmpcnt = strlen(&stream->linebuf[i+1]);
        memcpy(tmpbuf, &stream->linebuf[i+1], tmpcnt + 1);
        memcpy(tmpattr, &stream->attrbuf[i+1], tmpcnt * sizeof(tmpattr[0]));

        /* 
         *   terminate the buffer at the space or after the hyphen,
         *   depending on where we broke 
         */
        if (outissp(brkchar))
            stream->linebuf[i] = '\0';
        else
            stream->linebuf[i+1] = '\0';

        /* write out everything up to the word break */
        out_flushline(stream, TRUE);

        /* copy the next line into line buffer */
        memcpy(stream->linebuf, tmpbuf, tmpcnt + 1);
        memcpy(stream->attrbuf, tmpattr, tmpcnt * sizeof(tmpattr[0]));
        stream->linepos = tmpcnt;

        /* 
         *   figure what column we're now in - count all of the printable
         *   characters in the new line 
         */
        for (stream->linecol = 0, i = 0 ; i < stream->linepos ; ++i)
        {
            /* if it's printable, count it */
            if (((unsigned char)stream->linebuf[i]) >= 26)
                ++(stream->linecol);
        }
    }
    
    /* add the new character to buffer */
    stream->attrbuf[stream->linepos] = stream->cur_attr;
    stream->linebuf[stream->linepos++] = c;

    /* advance the column counter */
    ++(stream->linecol);
}